

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int element4(PROLOG_STATE *state,int tok,char *UNUSED_ptr,char *UNUSED_end,ENCODING *UNUSED_enc)

{
  ENCODING *UNUSED_enc_local;
  char *UNUSED_end_local;
  char *UNUSED_ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  if (tok == 0xf) {
    state_local._4_4_ = 0x27;
  }
  else if ((tok == 0x12) || (tok == 0x29)) {
    state->handler = element5;
    state_local._4_4_ = 0x33;
  }
  else {
    state_local._4_4_ = common(state,tok);
  }
  return state_local._4_4_;
}

Assistant:

static int PTRCALL
element4(PROLOG_STATE *state,
         int tok,
         const char *UNUSED_P(ptr),
         const char *UNUSED_P(end),
         const ENCODING *UNUSED_P(enc))
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ELEMENT_NONE;
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = element5;
    return XML_ROLE_CONTENT_ELEMENT;
  }
  return common(state, tok);
}